

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O2

Bool_conflict Ppmd7_Alloc(CPpmd7 *p,UInt32 size,ISzAlloc *alloc)

{
  Byte *pBVar1;
  Bool_conflict BVar2;
  
  BVar2 = 1;
  if ((p->Base == (Byte *)0x0) || (p->Size != size)) {
    (*alloc->Free)(alloc,p->Base);
    p->Size = 0;
    p->Base = (Byte *)0x0;
    p->AlignOffset = 4 - (size & 3);
    pBVar1 = (Byte *)(*alloc->Alloc)(alloc,(ulong)((size & 0xfffffffc) + 0x10));
    p->Base = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      BVar2 = 0;
    }
    else {
      p->Size = size;
    }
  }
  return BVar2;
}

Assistant:

Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size, ISzAlloc *alloc)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd7_Free(p, alloc);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)alloc->Alloc(alloc, p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}